

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void fmt::v7::detail::
     value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
     format_custom_arg<diy::DynamicPoint<float,4ul>,fmt::v7::detail::fallback_formatter<diy::DynamicPoint<float,4ul>,char,void>>
               (void *arg,parse_context_type *parse_ctx,
               basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx)

{
  size_t *psVar1;
  char *pcVar2;
  iterator pcVar3;
  buffer_appender<char> bVar4;
  undefined8 local_60;
  undefined4 local_58;
  undefined2 local_54;
  undefined1 local_52;
  undefined4 local_50;
  undefined4 local_48;
  undefined4 local_38;
  undefined4 local_30;
  
  local_60 = 0xffffffff00000000;
  local_58 = 0x200000;
  local_54 = 0;
  local_52 = 1;
  local_50 = 0;
  local_48 = 0;
  local_38 = 0;
  local_30 = 0;
  pcVar3 = formatter<fmt::v7::basic_string_view<char>,char,void>::
           parse<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>
                     ((formatter<fmt::v7::basic_string_view<char>,char,void> *)&local_60,parse_ctx);
  pcVar2 = (parse_ctx->format_str_).data_;
  (parse_ctx->format_str_).data_ = pcVar3;
  psVar1 = &(parse_ctx->format_str_).size_;
  *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)pcVar3));
  bVar4 = fallback_formatter<diy::DynamicPoint<float,4ul>,char,void>::
          format<fmt::v7::detail::buffer_appender<char>>
                    ((fallback_formatter<diy::DynamicPoint<float,4ul>,char,void> *)&local_60,
                     (DynamicPoint<float,_4UL> *)arg,ctx);
  (ctx->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  return;
}

Assistant:

static void format_custom_arg(const void* arg,
                                typename Context::parse_context_type& parse_ctx,
                                Context& ctx) {
    Formatter f;
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }